

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_gated_loudness(ebur128_state **sts,size_t size,double *out)

{
  undefined8 uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  size_t local_60;
  size_t start_index;
  size_t j;
  size_t i;
  size_t above_thresh_counter;
  double relative_threshold;
  double gated_loudness;
  ebur128_dq_entry *it;
  double *out_local;
  size_t size_local;
  ebur128_state **sts_local;
  
  relative_threshold = 0.0;
  above_thresh_counter = 0;
  i = 0;
  j = 0;
  while( true ) {
    if (size <= j) {
      it = (ebur128_dq_entry *)out;
      out_local = (double *)size;
      size_local = (size_t)sts;
      for (j = 0; j < out_local; j = j + 1) {
        if (*(long *)(size_local + j * 8) != 0) {
          ebur128_calc_relative_threshold
                    (*(ebur128_state **)(size_local + j * 8),&i,(double *)&above_thresh_counter);
        }
      }
      if (i == 0) {
        it->z = -INFINITY;
      }
      else {
        auVar4._8_4_ = (int)(i >> 0x20);
        auVar4._0_8_ = i;
        auVar4._12_4_ = 0x45300000;
        above_thresh_counter =
             (size_t)(relative_gate_factor *
                     ((double)above_thresh_counter /
                     ((auVar4._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0))));
        i = 0;
        if (histogram_energy_boundaries[0] <= (double)above_thresh_counter) {
          local_60 = find_histogram_index((double)above_thresh_counter);
          if (histogram_energies[local_60] <= (double)above_thresh_counter &&
              (double)above_thresh_counter != histogram_energies[local_60]) {
            local_60 = local_60 + 1;
          }
        }
        else {
          local_60 = 0;
        }
        for (j = 0; j < out_local; j = j + 1) {
          if (*(long *)(size_local + j * 8) != 0) {
            if (*(int *)(*(long *)(*(long *)(size_local + j * 8) + 0x10) + 200) == 0) {
              for (gated_loudness =
                        *(double *)(*(long *)(*(long *)(size_local + j * 8) + 0x10) + 0x88);
                  gated_loudness != 0.0; gated_loudness = *(double *)((long)gated_loudness + 8)) {
                if ((double)above_thresh_counter <= *(double *)gated_loudness) {
                  i = i + 1;
                  relative_threshold = *(double *)gated_loudness + relative_threshold;
                }
              }
            }
            else {
              for (start_index = local_60; start_index < 1000; start_index = start_index + 1) {
                uVar1 = *(undefined8 *)
                         (*(long *)(*(long *)(*(long *)(size_local + j * 8) + 0x10) + 0xd0) +
                         start_index * 8);
                auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
                auVar3._0_8_ = uVar1;
                auVar3._12_4_ = 0x45300000;
                relative_threshold =
                     ((auVar3._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) *
                     histogram_energies[start_index] + relative_threshold;
                i = *(long *)(*(long *)(*(long *)(*(long *)(size_local + j * 8) + 0x10) + 0xd0) +
                             start_index * 8) + i;
              }
            }
          }
        }
        if (i == 0) {
          it->z = -INFINITY;
        }
        else {
          auVar5._8_4_ = (int)(i >> 0x20);
          auVar5._0_8_ = i;
          auVar5._12_4_ = 0x45300000;
          relative_threshold =
               relative_threshold /
               ((auVar5._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0));
          dVar2 = ebur128_energy_to_loudness(relative_threshold);
          it->z = dVar2;
        }
      }
      return 0;
    }
    if ((sts[j] != (ebur128_state *)0x0) && ((sts[j]->mode & 5U) != 5)) break;
    j = j + 1;
  }
  return 2;
}

Assistant:

static int
ebur128_gated_loudness(ebur128_state** sts, size_t size, double* out) {
  struct ebur128_dq_entry* it;
  double gated_loudness = 0.0;
  double relative_threshold = 0.0;
  size_t above_thresh_counter = 0;
  size_t i, j, start_index;

  for (i = 0; i < size; i++) {
    if (sts[i] && (sts[i]->mode & EBUR128_MODE_I) != EBUR128_MODE_I) {
      return EBUR128_ERROR_INVALID_MODE;
    }
  }

  for (i = 0; i < size; i++) {
    if (!sts[i]) {
      continue;
    }
    ebur128_calc_relative_threshold(sts[i], &above_thresh_counter,
                                    &relative_threshold);
  }
  if (!above_thresh_counter) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  relative_threshold /= (double) above_thresh_counter;
  relative_threshold *= relative_gate_factor;

  above_thresh_counter = 0;
  if (relative_threshold < histogram_energy_boundaries[0]) {
    start_index = 0;
  } else {
    start_index = find_histogram_index(relative_threshold);
    if (relative_threshold > histogram_energies[start_index]) {
      ++start_index;
    }
  }
  for (i = 0; i < size; i++) {
    if (!sts[i]) {
      continue;
    }
    if (sts[i]->d->use_histogram) {
      for (j = start_index; j < 1000; ++j) {
        gated_loudness +=
            sts[i]->d->block_energy_histogram[j] * histogram_energies[j];
        above_thresh_counter += sts[i]->d->block_energy_histogram[j];
      }
    } else {
      STAILQ_FOREACH(it, &sts[i]->d->block_list, entries) {
        if (it->z >= relative_threshold) {
          ++above_thresh_counter;
          gated_loudness += it->z;
        }
      }
    }
  }
  if (!above_thresh_counter) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }
  gated_loudness /= (double) above_thresh_counter;
  *out = ebur128_energy_to_loudness(gated_loudness);
  return EBUR128_SUCCESS;
}